

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

char * findMessagePropertyStart
                 (PMQTTTRANSPORT_HANDLE_DATA transportData,char *topic_name,
                 IOTHUB_IDENTITY_TYPE type)

{
  char *pcVar1;
  size_t sVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l;
  char *mqtt_message_queue_topic;
  char *input_queue_topic;
  char *propertiesStart;
  IOTHUB_IDENTITY_TYPE type_local;
  char *topic_name_local;
  PMQTTTRANSPORT_HANDLE_DATA transportData_local;
  
  if (type == IOTHUB_TYPE_EVENT_QUEUE) {
    pcVar1 = STRING_c_str(transportData->topic_InputQueue);
    sVar2 = strlen(pcVar1);
    input_queue_topic = topic_name + (sVar2 - 1);
  }
  else if (type == IOTHUB_TYPE_TELEMETRY) {
    pcVar1 = STRING_c_str(transportData->topic_MqttMessage);
    sVar2 = strlen(pcVar1);
    input_queue_topic = topic_name + (sVar2 - 1);
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"findMessagePropertyStart",0x65c,1,"ERROR: type %d is not expected",type);
    }
    input_queue_topic = (char *)0x0;
  }
  return input_queue_topic;
}

Assistant:

static const char* findMessagePropertyStart(PMQTTTRANSPORT_HANDLE_DATA transportData, const char* topic_name, IOTHUB_IDENTITY_TYPE type)
{
    const char *propertiesStart;

    if (type == IOTHUB_TYPE_EVENT_QUEUE)
    {
        const char* input_queue_topic = STRING_c_str(transportData->topic_InputQueue);
        // Substract one from queue length to reflect this having an extra # we subscribed to
        propertiesStart = topic_name + (strlen(input_queue_topic) - 1);
    }
    else if (type == IOTHUB_TYPE_TELEMETRY)
    {
        const char* mqtt_message_queue_topic = STRING_c_str(transportData->topic_MqttMessage);
        // Substract one from queue length to reflect this having an extra # we subscribed to
        propertiesStart = topic_name + (strlen(mqtt_message_queue_topic) - 1);
    }
    else
    {
        LogError("ERROR: type %d is not expected", type);
        propertiesStart = NULL;
    }

    return propertiesStart;
}